

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  Classifier val_type;
  bool bVar1;
  reference current;
  HorribleError *this_00;
  Classifier local_91;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  Classifier local_22;
  byte local_21;
  Classifier classifier;
  bool *pbStack_20;
  bool retval;
  bool *positional_only_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  local_21 = 1;
  pbStack_20 = positional_only;
  positional_only_local = (bool *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  if ((*positional_only & 1U) == 0) {
    current = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back(args);
    local_91 = _recognize(this,current,true);
  }
  else {
    local_91 = NONE;
  }
  local_22 = local_91;
  switch(local_91) {
  case NONE:
    local_21 = _parse_positional(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)positional_only_local,false);
    if (((bool)local_21) && ((this->positionals_at_end_ & 1U) != 0)) {
      *pbStack_20 = true;
    }
    break;
  case POSITIONAL_MARK:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)positional_only_local);
    *pbStack_20 = true;
    bVar1 = _has_remaining_positionals(this);
    val_type = local_22;
    if ((bVar1) || (this->parent_ == (App *)0x0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_48,"--",&local_49);
      _move_to_missing(this,val_type,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else {
      local_21 = 0;
    }
    break;
  case SHORT:
  case LONG:
  case WINDOWS_STYLE:
    local_21 = _parse_arg(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)positional_only_local,local_91,false);
    break;
  case SUBCOMMAND:
    local_21 = _parse_subcommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)positional_only_local);
    break;
  case SUBCOMMAND_TERMINATOR:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)positional_only_local);
    local_21 = 0;
    break;
  default:
    this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_80,"unrecognized classifier (you should not see this!)",&local_81);
    HorribleError::HorribleError(this_00,&local_80);
    __cxa_throw(this_00,&HorribleError::typeinfo,HorribleError::~HorribleError);
  }
  return (bool)(local_21 & 1);
}

Assistant:

CLI11_INLINE bool App::_parse_single(std::vector<std::string> &args, bool &positional_only) {
    bool retval = true;
    detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
    switch(classifier) {
    case detail::Classifier::POSITIONAL_MARK:
        args.pop_back();
        positional_only = true;
        if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
            retval = false;
        } else {
            _move_to_missing(classifier, "--");
        }
        break;
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
        // treat this like a positional mark if in the parent app
        args.pop_back();
        retval = false;
        break;
    case detail::Classifier::SUBCOMMAND:
        retval = _parse_subcommand(args);
        break;
    case detail::Classifier::LONG:
    case detail::Classifier::SHORT:
    case detail::Classifier::WINDOWS_STYLE:
        // If already parsed a subcommand, don't accept options_
        retval = _parse_arg(args, classifier, false);
        break;
    case detail::Classifier::NONE:
        // Probably a positional or something for a parent (sub)command
        retval = _parse_positional(args, false);
        if(retval && positionals_at_end_) {
            positional_only = true;
        }
        break;
        // LCOV_EXCL_START
    default:
        throw HorribleError("unrecognized classifier (you should not see this!)");
        // LCOV_EXCL_STOP
    }
    return retval;
}